

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLBigDecimal.cpp
# Opt level: O0

int __thiscall xercesc_4_0::XMLBigDecimal::toCompare(XMLBigDecimal *this,XMLBigDecimal *other)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  XMLCh *str1;
  XMLCh *str2;
  int res;
  uint rIntDigit;
  uint lIntDigit;
  int lSign;
  XMLBigDecimal *other_local;
  XMLBigDecimal *this_local;
  
  iVar1 = (*(this->super_XMLNumber).super_XSerializable._vptr_XSerializable[7])();
  iVar2 = (*(other->super_XMLNumber).super_XSerializable._vptr_XSerializable[7])();
  if (iVar1 == iVar2) {
    if (iVar1 == 0) {
      this_local._4_4_ = 0;
    }
    else {
      uVar3 = getTotalDigit(this);
      uVar4 = getScale(this);
      uVar5 = getTotalDigit(other);
      uVar6 = getScale(other);
      this_local._4_4_ = iVar1;
      if (uVar3 - uVar4 <= uVar5 - uVar6) {
        if (uVar3 - uVar4 < uVar5 - uVar6) {
          this_local._4_4_ = -iVar1;
        }
        else {
          str1 = getValue(this);
          str2 = getValue(other);
          iVar2 = XMLString::compareString(str1,str2);
          if (iVar2 < 1) {
            if (iVar2 < 0) {
              this_local._4_4_ = -iVar1;
            }
            else {
              this_local._4_4_ = 0;
            }
          }
        }
      }
    }
  }
  else {
    iVar2 = (*(other->super_XMLNumber).super_XSerializable._vptr_XSerializable[7])();
    this_local._4_4_ = -1;
    if (iVar2 < iVar1) {
      this_local._4_4_ = 1;
    }
  }
  return this_local._4_4_;
}

Assistant:

int XMLBigDecimal::toCompare(const XMLBigDecimal& other) const
{
    /***
     * different sign
     */
    int lSign = this->getSign();
    if (lSign != other.getSign())
        return (lSign > other.getSign() ? 1 : -1);

    /***
     * same sign, zero
     */
    if (lSign == 0)    // optimization
        return 0;

    /***
     * same sign, non-zero
     */
    unsigned int lIntDigit = this->getTotalDigit() - this->getScale();
    unsigned int rIntDigit = other.getTotalDigit() - other.getScale();

    if (lIntDigit > rIntDigit)
    {
        return 1 * lSign;
    }
    else if (lIntDigit < rIntDigit)
    {
        return -1 * lSign;
    }
    else  // compare fraction
    {
        int res = XMLString::compareString
        ( this->getValue()
        , other.getValue()
        );

        if (res > 0)
            return 1 * lSign;
        else if (res < 0)
            return -1 * lSign;
        else
            return 0;
    }

}